

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strtoll.c
# Opt level: O2

longlong strtoll(char *__nptr,char **__endptr,int __base)

{
  unsigned_long uVar1;
  uintmax_t error;
  unsigned_long uVar2;
  char sign;
  char *p;
  char local_29;
  char *local_28;
  uint local_1c;
  
  local_29 = '+';
  local_1c = __base;
  local_28 = _PDCLIB_strtox_prelim(__nptr,&local_29,(int *)&local_1c);
  if (local_1c - 0x25 < 0xffffffdd) {
    uVar2 = 0;
  }
  else {
    error = 0x8000000000000000;
    if (local_29 == '+') {
      error = 0x7fffffffffffffff;
    }
    uVar1 = _PDCLIB_strtox_main(&local_28,local_1c,error,error / local_1c,
                                (int)(error % (ulong)local_1c),&local_29);
    if (__endptr != (char **)0x0) {
      if (local_28 != (char *)0x0) {
        __nptr = local_28;
      }
      *__endptr = __nptr;
    }
    uVar2 = -uVar1;
    if (local_29 == '+') {
      uVar2 = uVar1;
    }
  }
  return uVar2;
}

Assistant:

long long int strtoll( const char * s, char ** endptr, int base )
{
    long long int rc;
    char sign = '+';
    const char * p = _PDCLIB_strtox_prelim( s, &sign, &base );

    if ( base < 2 || base > 36 )
    {
        return 0;
    }

    if ( sign == '+' )
    {
        rc = ( long long int )_PDCLIB_strtox_main( &p, ( unsigned )base, ( uintmax_t )LLONG_MAX, ( uintmax_t )( LLONG_MAX / base ), ( int )( LLONG_MAX % base ), &sign );
    }
    else
    {
        rc = ( long long int )_PDCLIB_strtox_main( &p, ( unsigned )base, ( uintmax_t )LLONG_MIN, ( uintmax_t )( LLONG_MIN / -base ), ( int )( -( LLONG_MIN % base ) ), &sign );
    }

    if ( endptr != NULL )
    {
        *endptr = ( p != NULL ) ? ( char * ) p : ( char * ) s;
    }

    return ( sign == '+' ) ? rc : -rc;
}